

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_charset.hpp
# Opt level: O2

escape_value<char,_unsigned_short>
boost::xpressive::detail::
parse_escape<char_const*,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          (char **begin,char *end,
          compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          *tr)

{
  byte *pbVar1;
  char_class_type cVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  unsigned_long line;
  bool cond;
  escape_value<char,_unsigned_short> eVar8;
  
  ensure_(*begin != end,error_escape,"unexpected end of pattern found",
          "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
          ,
          "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
          ,0x55);
  cVar2 = cpp_regex_traits<char>::lookup_classname<char_const*>
                    ((cpp_regex_traits<char> *)tr,*begin,*begin + 1,
                     SUB41((tr->flags_ & icase_) >> 1,0));
  if (cVar2 != 0) {
    uVar5 = (ulong)cVar2 | 0x200000000;
    uVar7 = 0;
    goto LAB_00129ce8;
  }
  iVar3 = cpp_regex_traits<char>::value((cpp_regex_traits<char> *)tr,**begin,8);
  if (iVar3 != -1) {
    uVar4 = toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                      (begin,end,&tr->traits_,8,0x1ff);
    uVar7 = (ulong)uVar4;
    numeric::convdetail::
    generic_range_checker<boost::numeric::conversion_traits<unsigned_char,_int>,_boost::numeric::convdetail::LT_Zero<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::convdetail::GT_HiT<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::xpressive::detail::char_overflow_handler>
    ::validate_range(uVar4);
    goto LAB_00129ce6;
  }
  pbVar1 = (byte *)*begin;
  uVar7 = (ulong)*pbVar1;
  switch(*pbVar1) {
  case 0x61:
    *begin = (char *)(pbVar1 + 1);
    uVar7 = 7;
    break;
  default:
    *begin = (char *)(pbVar1 + 1);
    break;
  case 99:
    *begin = (char *)(pbVar1 + 1);
    ensure_(pbVar1 + 1 != (byte *)end,error_escape,"unexpected end of pattern found",
            "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
            ,0x77);
    ensure_((byte)((**begin & 0xdfU) + 0xbf) < 0x1a,error_escape,
            "invalid escape control letter; must be one of a-z or A-Z",
            "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
            ,0x7e);
    uVar7 = (ulong)(uint)(int)(**begin % ' ');
    numeric::convdetail::
    generic_range_checker<boost::numeric::conversion_traits<unsigned_char,_int>,_boost::numeric::convdetail::LT_Zero<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::convdetail::GT_HiT<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::xpressive::detail::char_overflow_handler>
    ::validate_range((int)(**begin % ' '));
    *begin = *begin + 1;
    break;
  case 0x65:
    numeric::convdetail::
    generic_range_checker<boost::numeric::conversion_traits<unsigned_char,_int>,_boost::numeric::convdetail::LT_Zero<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::convdetail::GT_HiT<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::xpressive::detail::char_overflow_handler>
    ::validate_range(0x1b);
    *begin = *begin + 1;
    uVar7 = 0x1b;
    break;
  case 0x66:
    *begin = (char *)(pbVar1 + 1);
    uVar7 = 0xc;
    break;
  case 0x6e:
    *begin = (char *)(pbVar1 + 1);
    uVar7 = 10;
    break;
  case 0x72:
    *begin = (char *)(pbVar1 + 1);
    uVar7 = 0xd;
    break;
  case 0x74:
    *begin = (char *)(pbVar1 + 1);
    uVar7 = 9;
    break;
  case 0x75:
    *begin = (char *)(pbVar1 + 1);
    ensure_(pbVar1 + 1 != (byte *)end,error_escape,"unexpected end of pattern found",
            "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
            ,0xa6);
    pcVar6 = *begin;
    uVar4 = toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                      (begin,end,&tr->traits_,0x10,0xffff);
    numeric::convdetail::
    generic_range_checker<boost::numeric::conversion_traits<unsigned_char,_int>,_boost::numeric::convdetail::LT_Zero<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::convdetail::GT_HiT<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::xpressive::detail::char_overflow_handler>
    ::validate_range(uVar4);
    cond = (long)*begin - (long)pcVar6 == 4;
    pcVar6 = "invalid Unicode escape : must be \\u HexDigit HexDigit HexDigit HexDigit";
    line = 0xaa;
    goto LAB_00129ee6;
  case 0x76:
    *begin = (char *)(pbVar1 + 1);
    uVar7 = 0xb;
    break;
  case 0x78:
    *begin = (char *)(pbVar1 + 1);
    ensure_(pbVar1 + 1 != (byte *)end,error_escape,"unexpected end of pattern found",
            "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
            ,0x9e);
    pcVar6 = *begin;
    uVar4 = toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                      (begin,end,&tr->traits_,0x10,0xff);
    numeric::convdetail::
    generic_range_checker<boost::numeric::conversion_traits<unsigned_char,_int>,_boost::numeric::convdetail::LT_Zero<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::convdetail::GT_HiT<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::xpressive::detail::char_overflow_handler>
    ::validate_range(uVar4);
    cond = (long)*begin - (long)pcVar6 == 2;
    pcVar6 = "invalid hex escape : must be \\x HexDigit HexDigit";
    line = 0xa2;
LAB_00129ee6:
    uVar7 = (ulong)uVar4;
    ensure_(cond,error_escape,pcVar6,
            "escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type> boost::xpressive::detail::parse_escape(FwdIter &, FwdIter, CompilerTraits &) [FwdIter = const char *, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>]"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
            ,line);
  }
LAB_00129ce6:
  uVar5 = 0;
LAB_00129ce8:
  eVar8._0_8_ = uVar7 & 0xff;
  eVar8.class_ = (short)uVar5;
  eVar8._10_2_ = (short)(uVar5 >> 0x10);
  eVar8.type_ = (int)(uVar5 >> 0x20);
  return eVar8;
}

Assistant:

escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type>
parse_escape(FwdIter &begin, FwdIter end, CompilerTraits &tr)
{
    using namespace regex_constants;
    typedef typename iterator_value<FwdIter>::type char_type;
    typedef typename CompilerTraits::regex_traits regex_traits;
    typedef typename regex_traits::char_class_type char_class_type;

    // define an unsigned type the same size as char_type
    typedef typename boost::uint_t<CHAR_BIT * sizeof(char_type)>::least uchar_t;
    BOOST_MPL_ASSERT_RELATION(sizeof(uchar_t), ==, sizeof(char_type));
    typedef numeric::conversion_traits<uchar_t, int> converstion_traits;

    BOOST_XPR_ENSURE_(begin != end, error_escape, "unexpected end of pattern found");
    numeric::converter<int, uchar_t, converstion_traits, char_overflow_handler> converter;
    escape_value<char_type,char_class_type> esc = { 0, 0, 0, escape_char };
    bool const icase = (0 != (regex_constants::icase_ & tr.flags()));
    regex_traits const &rxtraits = tr.traits();
    FwdIter tmp;

    esc.class_ = rxtraits.lookup_classname(begin, begin + 1, icase);
    if(0 != esc.class_)
    {
        esc.type_ = escape_class;
        return esc;
    }

    if(-1 != rxtraits.value(*begin, 8))
    {
        esc.ch_ = converter(toi(begin, end, rxtraits, 8, 0777));
        return esc;
    }

    switch(*begin)
    {
    // bell character
    case BOOST_XPR_CHAR_(char_type, 'a'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\a');
        ++begin;
        break;
    // escape character
    case BOOST_XPR_CHAR_(char_type, 'e'):
        esc.ch_ = converter(27);
        ++begin;
        break;
    // control character
    case BOOST_XPR_CHAR_(char_type, 'c'):
        BOOST_XPR_ENSURE_(++begin != end, error_escape, "unexpected end of pattern found");
        BOOST_XPR_ENSURE_
        (
            rxtraits.in_range(BOOST_XPR_CHAR_(char_type, 'a'), BOOST_XPR_CHAR_(char_type, 'z'), *begin)
         || rxtraits.in_range(BOOST_XPR_CHAR_(char_type, 'A'), BOOST_XPR_CHAR_(char_type, 'Z'), *begin)
          , error_escape
          , "invalid escape control letter; must be one of a-z or A-Z"
        );
        // Convert to character according to ECMA-262, section 15.10.2.10:
        esc.ch_ = converter(*begin % 32);
        ++begin;
        break;
    // formfeed character
    case BOOST_XPR_CHAR_(char_type, 'f'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\f');
        ++begin;
        break;
    // newline
    case BOOST_XPR_CHAR_(char_type, 'n'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\n');
        ++begin;
        break;
    // return
    case BOOST_XPR_CHAR_(char_type, 'r'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\r');
        ++begin;
        break;
    // horizontal tab
    case BOOST_XPR_CHAR_(char_type, 't'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\t');
        ++begin;
        break;
    // vertical tab
    case BOOST_XPR_CHAR_(char_type, 'v'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\v');
        ++begin;
        break;
    // hex escape sequence
    case BOOST_XPR_CHAR_(char_type, 'x'):
        BOOST_XPR_ENSURE_(++begin != end, error_escape, "unexpected end of pattern found");
        tmp = begin;
        esc.ch_ = converter(toi(begin, end, rxtraits, 16, 0xff));
        BOOST_XPR_ENSURE_(2 == std::distance(tmp, begin), error_escape, "invalid hex escape : "
            "must be \\x HexDigit HexDigit");
        break;
    // Unicode escape sequence
    case BOOST_XPR_CHAR_(char_type, 'u'):
        BOOST_XPR_ENSURE_(++begin != end, error_escape, "unexpected end of pattern found");
        tmp = begin;
        esc.ch_ = converter(toi(begin, end, rxtraits, 16, 0xffff));
        BOOST_XPR_ENSURE_(4 == std::distance(tmp, begin), error_escape, "invalid Unicode escape : "
            "must be \\u HexDigit HexDigit HexDigit HexDigit");
        break;
    // backslash
    case BOOST_XPR_CHAR_(char_type, '\\'):
        //esc.ch_ = BOOST_XPR_CHAR_(char_type, '\\');
        //++begin;
        //break;
    // all other escaped characters represent themselves
    default:
        esc.ch_ = *begin;
        ++begin;
        break;
    }

    return esc;
}